

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alist.c
# Opt level: O0

int array_list_add(p_array_list alist,void *item)

{
  int iVar1;
  size_t sVar2;
  int local_24;
  int index;
  int i;
  void *item_local;
  p_array_list alist_local;
  
  local_24 = 0;
  while( true ) {
    if (alist->size <= (ulong)(long)local_24) {
      sVar2 = expand_array_list(alist);
      iVar1 = (int)(sVar2 >> 1) + 1;
      alist->array[iVar1] = item;
      alist->count = alist->count + 1;
      return iVar1;
    }
    if (alist->array[local_24] == (void *)0x0) break;
    local_24 = local_24 + 1;
  }
  alist->array[local_24] = item;
  alist->count = alist->count + 1;
  return local_24;
}

Assistant:

int array_list_add(p_array_list alist, void* item) {
    for (int i = 0; i < alist->size; i++) {
        if (alist->array[i] == 0) {
            alist->array[i] = item;
            alist->count++;
            return i;
        }
    }
    int index = (int) ((expand_array_list(alist) / 2) + 1);
    alist->array[index] = item;
    alist->count++;
    return index;
}